

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workqueue.h
# Opt level: O3

void __thiscall rengine::WorkQueue::run(WorkQueue *this)

{
  list<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  _List_node_base *p_Var3;
  undefined1 local_58 [8];
  unique_lock<std::mutex> locker;
  shared_ptr<rengine::WorkQueue::Job> job;
  
  if (this->m_running == true) {
    this_00 = &this->m_jobs;
    do {
      locker._M_device._0_1_ = 0;
      local_58 = (undefined1  [8])&this->m_mutex;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_58);
      locker._M_device._0_1_ = 1;
      p_Var3 = (this_00->
               super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var3 == (_List_node_base *)this_00) {
        std::condition_variable::wait((unique_lock *)&this->m_condition);
        p_Var3 = (this_00->
                 super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
      }
      locker._M_owns = false;
      locker._9_7_ = 0;
      job.super___shared_ptr<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if (p_Var3 != (_List_node_base *)this_00) {
        locker._8_8_ = p_Var3[1]._M_next;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&job,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var3[1]._M_prev);
        std::__cxx11::
        list<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
        ::_M_erase(this_00,(this_00->
                           super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
                           )._M_impl._M_node.super__List_node_base._M_next);
      }
      bVar1 = this->m_running;
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_58);
      if ((bVar1 != false) && (locker._8_8_ != 0)) {
        if (*(char *)(locker._8_8_ + 0x60) == '\x01') {
LAB_00117faf:
          __assert_fail("!job->m_completed",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/workqueue.h"
                        ,0x9f,"void rengine::WorkQueue::run()");
        }
        (**(code **)(*(long *)locker._8_8_ + 0x10))();
        iVar2 = pthread_mutex_lock((pthread_mutex_t *)(locker._8_8_ + 8));
        if (iVar2 != 0) {
          std::__throw_system_error(iVar2);
          goto LAB_00117faf;
        }
        *(undefined1 *)(locker._8_8_ + 0x60) = 1;
        std::condition_variable::notify_one();
        pthread_mutex_unlock((pthread_mutex_t *)(locker._8_8_ + 8));
      }
      if (job.super___shared_ptr<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   job.super___shared_ptr<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_58);
    } while (bVar1 != false);
  }
  return;
}

Assistant:

inline void WorkQueue::run()
{
    bool running = m_running;
    while (running) {
        std::unique_lock<std::mutex> locker(m_mutex);
        if (m_jobs.empty()) {
            m_condition.wait(locker);
        }
        std::shared_ptr<Job> job;
        if (!m_jobs.empty()) {
            job = m_jobs.front();
            m_jobs.pop_front();
        }

        // While still holding the mutex, check if we should abort..
        running = m_running;
        locker.unlock();

        // Then, if we're still running, execute the job, mark it completed
        // and then the signal potential waiter.
        if (running && job.get() != nullptr) {
            assert(!job->m_completed);
            job->onExecute();
            job->m_mutex.lock();
            job->m_completed = true;
            job->m_condition.notify_one();
            job->m_mutex.unlock();
        }
    }
}